

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE
IoTHubClient_LL_UploadToBlob_CreateContext
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *azureBlobSasUri)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  HTTPAPIEX_HANDLE pHVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *result;
  char *azureBlobSasUri_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle_local;
  
  if ((handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) || (azureBlobSasUri == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_CreateContext",0x3a5,1,
                "invalid argument detected handle=%p azureBlobSasUri=%p",handle,azureBlobSasUri);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)createUploadToBlobContextInstance();
    if ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)0x0)
    {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_CreateContext",0x3aa,1,
                  "Failed creating Upload to Blob context");
      }
    }
    else {
      iVar1 = parseAzureBlobSasUri
                        (azureBlobSasUri,
                         &((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->blobStorageHostname,
                         &((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->blobStorageRelativePath);
      if (iVar1 == 0) {
        ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->u2bClientData = handle;
        pHVar3 = Blob_CreateHttpConnection
                           (((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->blobStorageHostname,
                            ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->u2bClientData->
                            certificates,
                            &((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->u2bClientData->
                             http_proxy_options,
                            ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->u2bClientData->
                            networkInterface,
                            ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->u2bClientData->
                            blob_upload_timeout_millisecs);
        ((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->blobHttpApiHandle = pHVar3;
        if (((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l)->blobHttpApiHandle == (HTTPAPIEX_HANDLE)0x0
           ) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"IoTHubClient_LL_UploadToBlob_CreateContext",0x3c3,1,
                      "Failed creating HTTP connection to Azure Blob");
          }
          destroyUploadToBlobContextInstance((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_CreateContext",0x3b2,1,
                    "failed parsing Blob Storage SAS URI");
        }
        destroyUploadToBlobContextInstance((IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)l;
}

Assistant:

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE IoTHubClient_LL_UploadToBlob_CreateContext(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* azureBlobSasUri)
{
    IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT* result;

    if (handle == NULL || azureBlobSasUri == NULL)
    {
        LogError("invalid argument detected handle=%p azureBlobSasUri=%p", handle, azureBlobSasUri);
        result = NULL;
    }
    else if ((result = createUploadToBlobContextInstance()) == NULL)
    {
        LogError("Failed creating Upload to Blob context");
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (parseAzureBlobSasUri(azureBlobSasUri, &result->blobStorageHostname, &result->blobStorageRelativePath) != 0)
        {
            LogError("failed parsing Blob Storage SAS URI");
            destroyUploadToBlobContextInstance(result);
            result = NULL;
        }
        else
        {
            result->u2bClientData = upload_data;

            result->blobHttpApiHandle = Blob_CreateHttpConnection(
                result->blobStorageHostname,
                result->u2bClientData->certificates,
                &(result->u2bClientData->http_proxy_options),
                result->u2bClientData->networkInterface,
                result->u2bClientData->blob_upload_timeout_millisecs);

            if (result->blobHttpApiHandle == NULL)
            {
                LogError("Failed creating HTTP connection to Azure Blob");
                destroyUploadToBlobContextInstance(result);
                result = NULL;
            }
        }
    }

    return result;
}